

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

Attribute * Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::makeNewAttribute(void)

{
  Attribute *this;
  
  this = (Attribute *)operator_new(0x88);
  memset(this,0,0x88);
  Attribute::Attribute(this);
  this->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3960;
  this[1]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  this[2]._vptr_Attribute = (_func_int **)0x0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  this[5]._vptr_Attribute = (_func_int **)0x0;
  this[6]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  this[7]._vptr_Attribute = (_func_int **)0x0;
  this[8]._vptr_Attribute = (_func_int **)0x0;
  this[9]._vptr_Attribute = (_func_int **)0x0;
  this[10]._vptr_Attribute = (_func_int **)0x0;
  this[0xb]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  this[0xc]._vptr_Attribute = (_func_int **)0x0;
  this[0xd]._vptr_Attribute = (_func_int **)0x0;
  this[0xe]._vptr_Attribute = (_func_int **)0x0;
  this[0xf]._vptr_Attribute = (_func_int **)0x0;
  this[0x10]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  return this;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}